

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injection.cpp
# Opt level: O0

int main(void)

{
  array<unsigned_char,_26UL> *this;
  uint8_t *begin;
  uint16_t uVar1;
  uint16_t uVar2;
  int __fd;
  int iVar3;
  uint32_t uVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  iterator pvVar8;
  iterator __last;
  iterator pvVar9;
  iterator pvVar10;
  uchar *puVar11;
  reference pvVar12;
  pointer pvVar13;
  uchar *puVar14;
  iterator pvVar15;
  iterator pvVar16;
  pointer __x;
  uchar *puVar17;
  size_type __n;
  ssize_t sVar18;
  string local_1a0 [8];
  string message;
  uint16_t c0_1;
  uchar *puStack_178;
  uint16_t c1;
  uint16_t local_16e;
  int local_16c;
  uint16_t c2;
  uchar *puStack_168;
  int local_15c;
  uchar *puStack_158;
  uint seq;
  uchar *rudp_header;
  udphdr *udp_header;
  pseudo_header_t *pseudo_header;
  array<unsigned_char,_26UL> pseudo;
  uint16_t c0;
  iphdr *ip_header;
  undefined4 uStack_10c;
  array<unsigned_char,_6UL> mac;
  array<unsigned_char,_48UL> buf;
  size_t udp_payload_size;
  size_t ip_payload_size;
  size_t ether_payload_size;
  size_t total_pseudo_packet_size;
  size_t pseudo_rudp_offset;
  size_t pseudo_udp_offset;
  size_t pseudo_ip_offset;
  size_t total_packet_size;
  size_t rudp_offset;
  size_t udp_offset;
  size_t ip_offset;
  size_t ether_offset;
  size_t pseudo_header_size;
  size_t rudp_header_size;
  size_t udp_header_size;
  size_t ip_header_size;
  size_t ether_header_size;
  int bind_result;
  sockaddr_ll source_addr;
  ifreq interface;
  int sock;
  
  interface.ifr_ifru._20_4_ = 0;
  __fd = socket(0x11,3,0xff);
  if (__fd < 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fd45);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    memset(source_addr.sll_addr,0,0x28);
    strncpy((char *)source_addr.sll_addr,"lo",0x10);
    iVar3 = ioctl(__fd,0x8933,source_addr.sll_addr);
    if (iVar3 < 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fd80);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      close(__fd);
    }
    else {
      memset((void *)((long)&ether_header_size + 4),0,0x14);
      ether_header_size._4_2_ = 0x11;
      ether_header_size._6_2_ = htons(3);
      ether_header_size._0_4_ = bind(__fd,(sockaddr *)((long)&ether_header_size + 4),0x14);
      if ((int)ether_header_size < 0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fd96);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)ether_header_size);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        close(__fd);
      }
      else {
        pvVar8 = std::array<unsigned_char,_48UL>::begin
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        __last = std::array<unsigned_char,_48UL>::end
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        uStack_10c = 0;
        std::fill<unsigned_char*,int>(pvVar8,__last,&stack0xfffffffffffffef4);
        memset((void *)((long)&ip_header + 6),0,6);
        pvVar9 = std::array<unsigned_char,_6UL>::begin
                           ((array<unsigned_char,_6UL> *)((long)&ip_header + 6));
        pvVar10 = std::array<unsigned_char,_6UL>::end
                            ((array<unsigned_char,_6UL> *)((long)&ip_header + 6));
        pvVar8 = std::array<unsigned_char,_48UL>::begin
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        std::copy<unsigned_char*,unsigned_char*>(pvVar9,pvVar10,pvVar8);
        pvVar9 = std::array<unsigned_char,_6UL>::begin
                           ((array<unsigned_char,_6UL> *)((long)&ip_header + 6));
        pvVar10 = std::array<unsigned_char,_6UL>::end
                            ((array<unsigned_char,_6UL> *)((long)&ip_header + 6));
        pvVar8 = std::array<unsigned_char,_48UL>::begin
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        puVar11 = std::next<unsigned_char*>(pvVar8,6);
        std::copy<unsigned_char*,unsigned_char*>(pvVar9,pvVar10,puVar11);
        pvVar12 = std::array<unsigned_char,_48UL>::operator[]
                            ((array<unsigned_char,_48UL> *)
                             (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                              _M_elems + 2),0xc);
        *pvVar12 = '\b';
        pvVar12 = std::array<unsigned_char,_48UL>::operator[]
                            ((array<unsigned_char,_48UL> *)
                             (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                              _M_elems + 2),0xd);
        *pvVar12 = '\0';
        pvVar13 = std::array<unsigned_char,_48UL>::data
                            ((array<unsigned_char,_48UL> *)
                             (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                              _M_elems + 2));
        register0x00000000 = std::next<unsigned_char*>(pvVar13,0xe);
        *register0x00000000 = *register0x00000000 & 0xf | 0x40;
        *register0x00000000 = *register0x00000000 & 0xf0 | 5;
        uVar1 = htons(0x22);
        *(uint16_t *)(stack0xfffffffffffffee0 + 2) = uVar1;
        stack0xfffffffffffffee0[8] = 0x40;
        stack0xfffffffffffffee0[9] = 0x11;
        uVar1 = htons(0x4000);
        *(uint16_t *)(stack0xfffffffffffffee0 + 6) = uVar1;
        uVar4 = htonl(0xc0a80202);
        *(uint32_t *)(stack0xfffffffffffffee0 + 0xc) = uVar4;
        uVar4 = htonl(0xc0a80201);
        *(uint32_t *)(stack0xfffffffffffffee0 + 0x10) = uVar4;
        pvVar8 = std::array<unsigned_char,_48UL>::begin
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        puVar11 = std::next<unsigned_char*>(pvVar8,0xe);
        pvVar8 = std::array<unsigned_char,_48UL>::begin
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        puVar14 = std::next<unsigned_char*>(pvVar8,0x22);
        pseudo._M_elems._18_2_ = rudp::checksum(puVar11,puVar14);
        uVar1 = htons(pseudo._M_elems._18_2_);
        *(uint16_t *)(stack0xfffffffffffffee0 + 10) = uVar1;
        pvVar15 = std::array<unsigned_char,_26UL>::begin
                            ((array<unsigned_char,_26UL> *)((long)&pseudo_header + 4));
        pvVar16 = std::array<unsigned_char,_26UL>::end
                            ((array<unsigned_char,_26UL> *)((long)&pseudo_header + 4));
        pseudo_header._0_4_ = 0;
        std::fill<unsigned_char*,int>(pvVar15,pvVar16,(int *)&pseudo_header);
        __x = std::array<unsigned_char,_26UL>::data
                        ((array<unsigned_char,_26UL> *)((long)&pseudo_header + 4));
        udp_header = (udphdr *)std::next<unsigned_char*>(__x,0);
        *(undefined4 *)&udp_header->field_0 = *(undefined4 *)(stack0xfffffffffffffee0 + 0xc);
        *(undefined4 *)((long)&udp_header->field_0 + 4) =
             *(undefined4 *)(stack0xfffffffffffffee0 + 0x10);
        *(byte *)((long)&udp_header[1].field_0 + 1) = stack0xfffffffffffffee0[9];
        uVar1 = htons(0xe);
        udp_header[1].field_0.field_0.uh_dport = uVar1;
        pvVar13 = std::array<unsigned_char,_48UL>::data
                            ((array<unsigned_char,_48UL> *)
                             (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                              _M_elems + 2));
        rudp_header = std::next<unsigned_char*>(pvVar13,0x22);
        uVar1 = htons(8000);
        *(uint16_t *)rudp_header = uVar1;
        uVar1 = htons(8000);
        *(uint16_t *)(rudp_header + 2) = uVar1;
        uVar1 = htons(0xe);
        *(uint16_t *)(rudp_header + 4) = uVar1;
        pvVar8 = std::array<unsigned_char,_48UL>::begin
                           ((array<unsigned_char,_48UL> *)
                            (((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->
                             _M_elems + 2));
        puStack_158 = std::next<unsigned_char*>(pvVar8,0x2a);
        for (local_15c = 0; local_15c != 0x100; local_15c = local_15c + 1) {
          *puStack_158 = 'P';
          puStack_158[1] = '\x06';
          puStack_158[2] = (uchar)local_15c;
          puStack_158[3] = (uchar)local_15c + 0xff;
          puStack_168 = std::next<unsigned_char*>(puStack_158,4);
          local_16c = 0;
          boost::spirit::karma::
          generate<unsigned_char*,boost::spirit::terminal<boost::spirit::tag::big_word>,int>
                    (&stack0xfffffffffffffe98,
                     (terminal<boost::spirit::tag::big_word> *)&boost::spirit::big_word,&local_16c);
          begin = puStack_158;
          puVar11 = ((array<unsigned_char,_6UL> *)((long)register0x00000020 + -0x10a))->_M_elems + 2
          ;
          pvVar8 = std::array<unsigned_char,_48UL>::end((array<unsigned_char,_48UL> *)puVar11);
          local_16e = rudp::checksum(begin,pvVar8);
          puStack_178 = std::next<unsigned_char*>(puStack_158,4);
          boost::spirit::karma::
          generate<unsigned_char*,boost::spirit::terminal<boost::spirit::tag::big_word>,unsigned_short>
                    (&stack0xfffffffffffffe88,
                     (terminal<boost::spirit::tag::big_word> *)&boost::spirit::big_word,&local_16e);
          rudp_header[6] = '\0';
          rudp_header[7] = '\0';
          pvVar8 = std::array<unsigned_char,_48UL>::begin((array<unsigned_char,_48UL> *)puVar11);
          puVar14 = std::next<unsigned_char*>(pvVar8,0x22);
          pvVar8 = std::array<unsigned_char,_48UL>::end((array<unsigned_char,_48UL> *)puVar11);
          this = (array<unsigned_char,_26UL> *)((long)&pseudo_header + 4);
          pvVar15 = std::array<unsigned_char,_26UL>::begin(this);
          puVar17 = std::next<unsigned_char*>(pvVar15,0xc);
          std::copy<unsigned_char*,unsigned_char*>(puVar14,pvVar8,puVar17);
          pvVar15 = std::array<unsigned_char,_26UL>::begin(this);
          pvVar16 = std::array<unsigned_char,_26UL>::end(this);
          uVar2 = rudp::checksum(pvVar15,pvVar16);
          uVar1 = htons(uVar2);
          *(uint16_t *)(rudp_header + 6) = uVar1;
          uVar1 = htons((uint16_t)local_15c);
          *(uint16_t *)(stack0xfffffffffffffee0 + 4) = uVar1;
          stack0xfffffffffffffee0[10] = 0;
          stack0xfffffffffffffee0[0xb] = 0;
          pvVar8 = std::array<unsigned_char,_48UL>::begin((array<unsigned_char,_48UL> *)puVar11);
          puVar14 = std::next<unsigned_char*>(pvVar8,0xe);
          pvVar8 = std::array<unsigned_char,_48UL>::begin((array<unsigned_char,_48UL> *)puVar11);
          puVar17 = std::next<unsigned_char*>(pvVar8,0x22);
          uVar2 = rudp::checksum(puVar14,puVar17);
          uVar1 = htons(uVar2);
          *(uint16_t *)(stack0xfffffffffffffee0 + 10) = uVar1;
          std::__cxx11::string::string(local_1a0);
          pvVar13 = std::array<unsigned_char,_48UL>::data((array<unsigned_char,_48UL> *)puVar11);
          __n = std::array<unsigned_char,_48UL>::size((array<unsigned_char,_48UL> *)puVar11);
          sVar18 = write(__fd,pvVar13,__n);
          if (sVar18 < 0) {
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fdd3);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)ether_header_size);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            close(__fd);
            interface.ifr_ifru._20_4_ = 1;
          }
          std::__cxx11::string::~string(local_1a0);
          if (sVar18 < 0) {
            return interface.ifr_ifru._20_4_;
          }
        }
        close(__fd);
      }
    }
  }
  return 1;
}

Assistant:

int main() {
  int sock = socket( AF_PACKET, SOCK_RAW, IPPROTO_RAW );
  if (sock < 0) {
    std::cout << "ソケットを開けない" << std::endl;
    return 1;
  }
  ifreq interface;
  memset( &interface, 0, sizeof( interface ) );
  strncpy( interface.ifr_name, "lo", IFNAMSIZ );
  if( ioctl( sock, SIOCGIFINDEX, &interface ) < 0 ) {
    std::cout << "インターフェースが見つからない" << std::endl;
    close( sock );
    return 1;
  }
  sockaddr_ll source_addr;
  memset( &source_addr, 0, sizeof( sockaddr_ll ) );
  source_addr.sll_family = AF_PACKET;
  source_addr.sll_protocol = htons( ETH_P_ALL );
  source_addr.sll_ifindex = interface.ifr_ifindex;
  const auto bind_result = bind( sock, reinterpret_cast< sockaddr* >( &source_addr ), sizeof( sockaddr_ll ) );
  if( bind_result < 0 ) {
    std::cout << strerror( errno ) << std::endl;
    std::cout << "bindできない " << bind_result << std::endl;
    close( sock );
    return 1;
  }
  constexpr size_t ether_header_size = 14;
  constexpr size_t ip_header_size = 20;
  constexpr size_t udp_header_size = 8;
  constexpr size_t rudp_header_size = 6;
  constexpr size_t pseudo_header_size = 12;
  constexpr size_t ether_offset = 0;
  constexpr size_t ip_offset = ether_header_size;
  constexpr size_t udp_offset = ip_offset + ip_header_size;
  constexpr size_t rudp_offset = udp_offset + udp_header_size;
  constexpr size_t total_packet_size = rudp_offset + rudp_header_size;
  constexpr size_t pseudo_ip_offset = 0;
  constexpr size_t pseudo_udp_offset = pseudo_ip_offset + pseudo_header_size;
  constexpr size_t pseudo_rudp_offset = pseudo_udp_offset + udp_header_size;
  constexpr size_t total_pseudo_packet_size = pseudo_rudp_offset + rudp_header_size;
  constexpr size_t ether_payload_size = ip_header_size + udp_header_size + rudp_header_size;
  constexpr size_t ip_payload_size = udp_header_size + rudp_header_size;
  constexpr size_t udp_payload_size = rudp_header_size;
  namespace karma = boost::spirit::karma;
  std::array< uint8_t, total_packet_size > buf;
  std::fill( buf.begin(), buf.end(), 0 );
  std::array< uint8_t, 6 > mac{ 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
  std::copy( mac.begin(), mac.end(), buf.begin() );
  std::copy( mac.begin(), mac.end(), std::next( buf.begin(), 6 ) );
  buf[ 12 ] = 0x08;
  buf[ 13 ] = 0x00;ether_payload_size & 0xFF;
  auto ip_header = reinterpret_cast< iphdr* >( std::next( buf.data(), ip_offset ) );
  ip_header->version = 4;
  ip_header->ihl = 5;
  ip_header->tot_len = htons( ether_payload_size );
  ip_header->ttl = 0x40;
  ip_header->protocol = 0x11;
  ip_header->frag_off = htons( 0x02 << 13 );
  ip_header->saddr = htonl( ( 192 << 24 ) | ( 168 << 16 ) | ( 2 << 8 ) | 2 );
  ip_header->daddr = htonl( ( 192 << 24 ) | ( 168 << 16 ) | ( 2 << 8 ) | 1 );
  uint16_t c0 = rudp::checksum( std::next( buf.begin(), ip_offset ), std::next( buf.begin(), ip_offset + ip_header_size ) );
  ip_header->check = htons( c0 );
  std::array< uint8_t, total_pseudo_packet_size > pseudo;
  std::fill( pseudo.begin(), pseudo.end(), 0 );
  auto pseudo_header = reinterpret_cast< pseudo_header_t* >( std::next( pseudo.data(), pseudo_ip_offset ) );
  pseudo_header->saddr = ip_header->saddr;
  pseudo_header->daddr = ip_header->daddr;
  pseudo_header->protocol = ip_header->protocol;
  pseudo_header->tot_len = htons( udp_header_size + rudp_header_size );
  auto udp_header = reinterpret_cast< udphdr* >( std::next( buf.data(), udp_offset ) );
  udp_header->uh_sport = htons( port );
  udp_header->uh_dport = htons( port );
  udp_header->uh_ulen = htons( udp_header_size + rudp_header_size );
  auto rudp_header = std::next( buf.begin(), rudp_offset );
  for( unsigned int seq = 0; seq != 256u; ++seq ) {
    rudp_header[ 0 ] = 0x50;
    rudp_header[ 1 ] = 0x06;
    rudp_header[ 2 ] = uint8_t( seq );
    rudp_header[ 3 ] = uint8_t( seq - 1 );
    karma::generate( std::next( rudp_header, 4 ), karma::big_word, 0x0000 );
    uint16_t c2 = rudp::checksum( rudp_header, buf.end() );
    karma::generate( std::next( rudp_header, 4 ), karma::big_word, c2 );
    udp_header->uh_sum = 0;
    std::copy( std::next( buf.begin(), udp_offset ), buf.end(), std::next( pseudo.begin(), pseudo_udp_offset ) );
    uint16_t c1 = rudp::checksum( pseudo.begin(), pseudo.end() );
    udp_header->uh_sum = htons( c1 );
    ip_header->id = htons( seq );
    ip_header->check = 0;
    uint16_t c0 = rudp::checksum( std::next( buf.begin(), ip_offset ), std::next( buf.begin(), ip_offset + ip_header_size ) );
    ip_header->check = htons( c0 );
    std::string message;
    if( write( sock, buf.data(), buf.size() ) < 0 ) {
      std::cout << strerror( errno ) << std::endl;
      std::cout << "送信できない " << bind_result << std::endl;
      close( sock );
      return 1;
    }
  }
  close( sock );
  return 1;
}